

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::PushMessage(CConnman *this,CNode *pnode,CSerializedNetMsg *msg)

{
  pointer puVar1;
  _Head_base<0UL,_Transport_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  uint64_t bytes;
  long in_FS_OFFSET;
  pair<unsigned_long,_bool> pVar6;
  string_view source_file;
  string_view logging_function;
  Span<const_unsigned_char> __args_2;
  size_t nMessageSize;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock104;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  nMessageSize = (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  bVar3 = ::LogAcceptCategory(NET,Debug);
  if (bVar3) {
    local_50._M_dataplus._M_p = (pointer)pnode->id;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "PushMessage";
    logging_function._M_len = 0xb;
    LogPrintFormatInternal<std::__cxx11::string,unsigned_long,long>
              (logging_function,source_file,0xf02,NET,Debug,(ConstevalFormatString<3U>)0x6884af,
               &msg->m_type,&nMessageSize,(long *)&local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"-capturemessages",(allocator<char> *)&criticalblock104);
  bVar3 = ArgsManager::GetBoolArg(&gArgs,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar3) {
    puVar1 = (msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __args_2.m_size =
         (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)puVar1;
    __args_2.m_data = puVar1;
    std::
    function<void_(const_CAddress_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Span<const_unsigned_char>,_bool)>
    ::operator()(&CaptureMessage_abi_cxx11_,&pnode->addr,&msg->m_type,__args_2,false);
  }
  bVar3 = false;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock104,&pnode->cs_vSend,"pnode->cs_vSend",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xf12,false);
  _Var2._M_head_impl =
       (pnode->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
       _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
       super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
  (*(_Var2._M_head_impl)->_vptr_Transport[7])(&local_50,_Var2._M_head_impl,1);
  if (local_50.field_2._8_8_ == 0) {
    bVar3 = (pnode->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (pnode->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  }
  sVar5 = CSerializedNetMsg::GetMemoryUsage(msg);
  sVar5 = sVar5 + pnode->m_send_memusage;
  pnode->m_send_memusage = sVar5;
  iVar4 = (*((pnode->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[9])();
  if ((ulong)this->nSendBufferMaxSize < CONCAT44(extraout_var,iVar4) + sVar5) {
    LOCK();
    (pnode->fPauseSend)._M_base._M_i = true;
    UNLOCK();
  }
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::emplace_back<CSerializedNetMsg>
            (&pnode->vSendMsg,msg);
  if ((bVar3) && ((char)local_50._M_string_length == '\x01')) {
    pVar6 = SocketSendData(this,pnode);
    bytes = pVar6.first;
  }
  else {
    bytes = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock104.super_unique_lock);
  if (bytes != 0) {
    RecordBytesSent(this,bytes);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::PushMessage(CNode* pnode, CSerializedNetMsg&& msg)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    size_t nMessageSize = msg.data.size();
    LogDebug(BCLog::NET, "sending %s (%d bytes) peer=%d\n", msg.m_type, nMessageSize, pnode->GetId());
    if (gArgs.GetBoolArg("-capturemessages", false)) {
        CaptureMessage(pnode->addr, msg.m_type, msg.data, /*is_incoming=*/false);
    }

    TRACE6(net, outbound_message,
        pnode->GetId(),
        pnode->m_addr_name.c_str(),
        pnode->ConnectionTypeAsString().c_str(),
        msg.m_type.c_str(),
        msg.data.size(),
        msg.data.data()
    );

    size_t nBytesSent = 0;
    {
        LOCK(pnode->cs_vSend);
        // Check if the transport still has unsent bytes, and indicate to it that we're about to
        // give it a message to send.
        const auto& [to_send, more, _msg_type] =
            pnode->m_transport->GetBytesToSend(/*have_next_message=*/true);
        const bool queue_was_empty{to_send.empty() && pnode->vSendMsg.empty()};

        // Update memory usage of send buffer.
        pnode->m_send_memusage += msg.GetMemoryUsage();
        if (pnode->m_send_memusage + pnode->m_transport->GetSendMemoryUsage() > nSendBufferMaxSize) pnode->fPauseSend = true;
        // Move message to vSendMsg queue.
        pnode->vSendMsg.push_back(std::move(msg));

        // If there was nothing to send before, and there is now (predicted by the "more" value
        // returned by the GetBytesToSend call above), attempt "optimistic write":
        // because the poll/select loop may pause for SELECT_TIMEOUT_MILLISECONDS before actually
        // doing a send, try sending from the calling thread if the queue was empty before.
        // With a V1Transport, more will always be true here, because adding a message always
        // results in sendable bytes there, but with V2Transport this is not the case (it may
        // still be in the handshake).
        if (queue_was_empty && more) {
            std::tie(nBytesSent, std::ignore) = SocketSendData(*pnode);
        }
    }
    if (nBytesSent) RecordBytesSent(nBytesSent);
}